

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

int outformatlen_stream(out_stream_info *stream,char *s,size_t slen)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uchar uVar4;
  ushort uVar5;
  byte *pbVar6;
  out_stream_info *poVar7;
  bool bVar8;
  char cVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  char *cbp;
  char *extraout_RAX;
  char *extraout_RAX_00;
  undefined7 extraout_var;
  ushort *puVar13;
  ushort **ppuVar14;
  size_t sVar15;
  char *extraout_RAX_01;
  char **extraout_RAX_02;
  char **extraout_RAX_03;
  char **extraout_RAX_04;
  char **extraout_RAX_05;
  char **extraout_RAX_06;
  ulong uVar16;
  char **extraout_RAX_07;
  undefined8 extraout_RAX_08;
  undefined8 uVar17;
  undefined8 extraout_RAX_09;
  char **ppcVar18;
  byte *pbVar19;
  long lVar20;
  char *pcVar21;
  char **ppcVar22;
  out_stream_info *in_R9;
  ulong uVar23;
  char **ppcVar24;
  ushort *puVar25;
  uint uVar26;
  ulong uVar27;
  char **ppcVar28;
  bool bVar29;
  char **local_220;
  char **local_218;
  out_stream_info *local_210;
  int is_end_tag_1;
  undefined4 local_204;
  char **local_200;
  uint local_1f4;
  char *local_1f0;
  char fmsbuf [40];
  byte local_1c0 [8];
  char attrname [128];
  char fmsbuf_srch [40];
  byte abStack_39 [9];
  
  if ((G_recurse == 0) || (iVar11 = G_recurse, G_cur_stream == stream)) {
    G_recurse = G_recurse + 1;
    uVar23 = 0;
    if (slen == 0) {
      uVar27 = 0;
      local_218 = (char **)0x0;
      local_220 = (char **)s;
    }
    else {
      local_218 = (char **)(slen - 1);
      local_220 = (char **)(s + 1);
      uVar27 = (ulong)(byte)*s;
    }
    local_200 = &stream->html_title_ptr;
    local_1f0 = stream->html_title_buf;
    ppcVar22 = (char **)local_1f0;
    ppcVar28 = (char **)0x0;
    G_cur_stream = stream;
    local_210 = stream;
    bVar8 = false;
LAB_00218b8d:
    bVar29 = bVar8;
    ppcVar24 = local_200;
    poVar7 = local_210;
    iVar11 = (int)ppcVar22;
    bVar10 = (byte)uVar27;
    if (bVar10 != 0) {
      iVar11 = (int)(uVar27 & 0xff);
      bVar8 = bVar29;
      if ((int)uVar23 != 0) {
        if ((ppcVar28 == (char **)local_1c0 || bVar10 == 0x5c) ||
           ((stream->html_mode != 0 && ((bVar10 == 0x3c || (iVar11 == 0x26)))))) {
          outchar_stream(stream,'%');
          ppcVar22 = (char **)extraout_RAX;
          for (pbVar19 = (byte *)fmsbuf; pbVar19 < ppcVar28; pbVar19 = pbVar19 + 1) {
            outchar_stream(stream,*pbVar19);
            ppcVar22 = (char **)extraout_RAX_00;
          }
LAB_00219567:
          uVar23 = 0;
        }
        else {
          puVar13 = (ushort *)CONCAT71((int7)((ulong)ppcVar22 >> 8),bVar10 == 0x25);
          if (ppcVar28 == (char **)fmsbuf && bVar10 == 0x25) {
            outchar_stream(stream,'%');
LAB_00219155:
            uVar23 = 0;
          }
          else {
            if (bVar10 == 0x25) {
              *(byte *)ppcVar28 = 0;
              lVar20 = (long)fmsbuf[0];
              if (lVar20 < 0) {
LAB_00218cc4:
                bVar29 = true;
                local_204 = (undefined4)CONCAT71((int7)((ulong)puVar13 >> 8),1);
              }
              else {
                ppuVar14 = __ctype_b_loc();
                puVar13 = *ppuVar14;
                if ((*(byte *)((long)puVar13 + lVar20 * 2 + 1) & 1) == 0) goto LAB_00218cc4;
                if ((long)fmsbuf[1] < 1) {
                  bVar29 = true;
                }
                else {
                  bVar29 = (*(byte *)((long)puVar13 + (long)fmsbuf[1] * 2 + 1) & 1) == 0;
                }
                local_204 = 0;
              }
              strcpy(fmsbuf_srch,fmsbuf);
              os_strlwr(fmsbuf_srch);
              sVar15 = strlen(fmsbuf_srch);
              puVar13 = (ushort *)fmstop;
              for (puVar25 = (ushort *)fmsbase; puVar25 < puVar13;
                  puVar25 = (ushort *)((long)puVar25 + (ulong)uVar5 + 2)) {
                uVar5 = puVar25[1];
                if ((uVar5 - 2 == (int)sVar15) &&
                   (iVar11 = bcmp(puVar25 + 2,fmsbuf_srch,sVar15 & 0xffffffff), poVar7 = local_210,
                   iVar11 == 0)) {
                  uVar5 = *puVar25;
                  uVar4 = local_210->allcapsflag;
                  if (bVar29) {
                    if ((char)local_204 == '\0') {
                      poVar7->capsflag = '\x01';
                      poVar7->nocapsflag = '\0';
                      local_210->allcapsflag = '\0';
                    }
                  }
                  else {
                    local_210->allcapsflag = '\x01';
                    poVar7->capsflag = '\0';
                    poVar7->nocapsflag = '\0';
                  }
                  in_R9 = (out_stream_info *)(ulong)uVar5;
                  runpprop(runctx,(uchar **)0x0,0,0,cmdActor,uVar5,0,0,cmdActor);
                  poVar7->allcapsflag = uVar4;
                  poVar7->capsflag = '\0';
                  poVar7->nocapsflag = '\0';
                  puVar13 = (ushort *)fmstop;
                  break;
                }
              }
              stream = local_210;
              if (puVar25 == puVar13) {
                outchar_stream(local_210,'%');
                for (pbVar19 = (byte *)fmsbuf; pbVar19 < ppcVar28; pbVar19 = pbVar19 + 1) {
                  outchar_stream(stream,*pbVar19);
                }
                outchar_stream(stream,'%');
              }
              goto LAB_00219155;
            }
            *(byte *)ppcVar28 = bVar10;
            ppcVar28 = (char **)((long)ppcVar28 + 1);
            uVar23 = 1;
          }
          ppcVar22 = local_218;
          uVar27 = 0;
          if (local_218 != (char **)0x0) {
            local_218 = (char **)((long)local_218 + -1);
            ppcVar22 = local_220;
            uVar27 = (ulong)*(byte *)local_220;
            local_220 = (char **)((long)local_220 + 1);
          }
        }
        goto LAB_00218b8d;
      }
      switch(stream->html_mode_flag) {
      case 0:
        if ((bVar10 == 0x3c) || (stream->html_in_ignore == 0)) {
          uVar23 = 1;
          ppcVar22 = (char **)fmsbuf;
          if (bVar10 != 0x25) {
            if (iVar11 == 0x5c) {
              if (local_218 == (char **)0x0) {
                ppcVar24 = (char **)0x0;
                uVar23 = 0;
              }
              else {
                ppcVar24 = (char **)((long)local_218 + -1);
                uVar23 = (ulong)*(byte *)local_220;
                ppcVar22 = local_220;
                local_220 = (char **)((long)local_220 + 1);
                local_218 = ppcVar24;
              }
              bVar10 = (byte)uVar23;
              if ((((stream->capturing == 0) || (bVar10 == 0)) || (bVar10 == 0x5e)) ||
                 (bVar10 == 0x76)) {
                uVar27 = uVar23;
                bVar8 = true;
                if (bVar10 == 0) goto LAB_00218b8d;
                iVar11 = (int)uVar23;
                if (iVar11 == 0x20) {
                  if ((stream->html_target == 0) || (stream->html_mode == 0)) {
                    bVar10 = 0x1a;
                    goto LAB_00219485;
                  }
                  pcVar21 = "&nbsp;";
LAB_00219635:
                  outstring_stream(stream,pcVar21);
                }
                else if (iVar11 == 0x28) {
                  if ((stream->html_mode != 0) && (stream->html_target != 0)) {
                    pcVar21 = "<B>";
                    goto LAB_00219635;
                  }
                  *(byte *)&stream->cur_attr = (byte)stream->cur_attr | 1;
                }
                else if (iVar11 == 0x29) {
                  if ((stream->html_mode != 0) && (stream->html_target != 0)) {
                    pcVar21 = "</B>";
                    goto LAB_00219635;
                  }
                  *(byte *)&stream->cur_attr = (byte)stream->cur_attr & 0xfe;
                }
                else {
                  if (iVar11 == 0x2d) goto LAB_002191d2;
                  if (iVar11 == 0x76) {
                    stream->capsflag = '\0';
                    stream->nocapsflag = '\x01';
                  }
                  else if (iVar11 == 0x5e) {
                    stream->capsflag = '\x01';
                    stream->nocapsflag = '\0';
                  }
                  else if (iVar11 == 0x62) {
                    outblank_stream(stream);
                  }
                  else if (iVar11 == 0x6e) {
                    outflushn_stream(stream,1);
                  }
                  else {
                    if (iVar11 != 0x74) {
                      if (iVar11 != 0x48) goto LAB_00219485;
                      if (ppcVar24 == (char **)0x0) {
                        iVar11 = stream->html_target;
                        bVar10 = 0;
                      }
                      else {
                        local_218 = (char **)((long)ppcVar24 + -1);
                        ppcVar22 = (char **)((long)local_220 + 1);
                        bVar10 = *(byte *)local_220;
                        iVar11 = stream->html_target;
                        local_220 = ppcVar22;
                        if (bVar10 == 0x2d) {
                          if (iVar11 != 0) {
                            outflushn_stream(local_210,0);
                          }
                          poVar7->html_mode = 0;
                          stream = poVar7;
                          goto LAB_0021948d;
                        }
                      }
                      if (iVar11 != 0) {
                        outflushn_stream(local_210,0);
                      }
                      poVar7->html_mode = 1;
                      uVar23 = 0;
                      ppcVar22 = ppcVar28;
                      stream = local_210;
                      if ((bVar10 == 0) || (bVar10 == 0x2b)) goto LAB_00219490;
                      goto LAB_0021952f;
                    }
                    outtab_stream(stream);
                  }
                }
              }
              else {
                outchar_stream(stream,'\\');
                outchar_stream(stream,bVar10);
                if (bVar10 != 0x2d) goto LAB_0021948d;
LAB_002191d2:
                if (ppcVar24 == (char **)0x0) {
                  ppcVar24 = (char **)0x0;
                  bVar10 = 0;
                }
                else {
                  ppcVar24 = (char **)((long)ppcVar24 + -1);
                  bVar10 = *(byte *)local_220;
                  local_220 = (char **)((long)local_220 + 1);
                  local_218 = ppcVar24;
                }
                outchar_stream(stream,bVar10);
                if (ppcVar24 == (char **)0x0) {
                  bVar10 = 0;
                }
                else {
                  local_218 = (char **)((long)ppcVar24 + -1);
                  bVar10 = *(byte *)local_220;
                  local_220 = (char **)((long)local_220 + 1);
                }
LAB_0021952f:
                outchar_stream(stream,bVar10);
              }
            }
            else {
              if (stream->html_target == 0) {
                if (stream->html_mode != 0) {
                  if (bVar10 == 0x26) {
                    bVar10 = out_parse_entity(fmsbuf_srch,(size_t)&local_220,(char **)&local_218,
                                              (size_t *)&switchD_00218c0d::switchdataD_002b91e0);
                    uVar27 = (ulong)bVar10;
                    outstring_noxlat_stream(stream,fmsbuf_srch);
                    ppcVar22 = (char **)extraout_RAX_01;
                    goto LAB_00219567;
                  }
                  if (iVar11 == 0x3c) {
                    bVar10 = read_tag(attrname,(size_t)&is_end_tag_1,(int *)&local_220,
                                      (char **)&local_218,(size_t *)0x0,in_R9);
                    uVar27 = (ulong)bVar10;
                    uVar12 = stricmp(attrname,"br");
                    ppcVar22 = (char **)(ulong)uVar12;
                    if (uVar12 == 0) {
                      if (stream->html_in_ignore == 0) {
                        if (stream->linepos == '\0') {
                          stream->html_defer_br = 2;
                        }
                        else {
                          stream->html_defer_br = 1;
                        }
                      }
                    }
                    else {
                      iVar11 = stricmp(attrname,"b");
                      if ((((iVar11 == 0) || (iVar11 = stricmp(attrname,"i"), iVar11 == 0)) ||
                          (iVar11 = stricmp(attrname,"em"), iVar11 == 0)) ||
                         (iVar11 = stricmp(attrname,"strong"), iVar11 == 0)) {
                        ppcVar22 = (char **)(ulong)(byte)attrname[0];
                        if (((attrname._0_4_ & 0xff) == 0x42) || ((attrname._0_4_ & 0xff) == 0x45))
                        {
LAB_00219687:
                          local_1f4 = 1;
                        }
                        else {
                          uVar12 = attrname._0_4_ & 0xff;
                          if (uVar12 == 0x49) {
LAB_00219920:
                            local_1f4 = 2;
                          }
                          else {
                            if ((uVar12 != 0x53) && (uVar12 != 0x73)) {
                              if (uVar12 != 0x65) {
                                if ((attrname._0_4_ & 0xff) == 0x69) goto LAB_00219920;
                                if ((attrname._0_4_ & 0xff) != 0x62) goto LAB_00219923;
                              }
                              goto LAB_00219687;
                            }
                            local_1f4 = 0;
                          }
                        }
LAB_00219923:
                        if (stream->html_in_ignore == 0) {
                          if (is_end_tag_1 == 0) {
                            stream->cur_attr = stream->cur_attr | local_1f4;
                          }
                          else {
                            ppcVar22 = (char **)(ulong)~local_1f4;
                            stream->cur_attr = stream->cur_attr & ~local_1f4;
                          }
                        }
                      }
                      else {
                        uVar12 = stricmp(attrname,"p");
                        ppcVar22 = (char **)(ulong)uVar12;
                        if (uVar12 == 0) {
                          if (stream->html_in_ignore == 0) {
LAB_00219960:
                            outblank_stream(stream);
                            ppcVar22 = extraout_RAX_04;
                          }
                        }
                        else {
                          uVar12 = stricmp(attrname,"tab");
                          ppcVar22 = (char **)(ulong)uVar12;
                          if (uVar12 == 0) {
                            if (stream->html_in_ignore == 0) {
                              outtab_stream(stream);
                              ppcVar22 = extraout_RAX_05;
                            }
                          }
                          else {
                            uVar12 = stricmp(attrname,"img");
                            if ((uVar12 == 0) || (uVar12 = stricmp(attrname,"sound"), uVar12 == 0))
                            {
                              ppcVar22 = (char **)(ulong)uVar12;
                              stream->html_allow_alt = 1;
                            }
                            else {
                              uVar12 = stricmp(attrname,"hr");
                              ppcVar22 = (char **)(ulong)uVar12;
                              if (uVar12 == 0) {
                                if (stream->html_in_ignore == 0) {
                                  outflushn_stream(stream,1);
                                  for (uVar12 = G_os_linewidth - 1; stream = local_210,
                                      0 < (int)uVar12; uVar12 = uVar12 - (int)sVar15) {
                                    sVar15 = 99;
                                    if (uVar12 < 99) {
                                      sVar15 = (size_t)uVar12;
                                    }
                                    memset(fmsbuf_srch,0x5f,sVar15);
                                    fmsbuf_srch[sVar15] = '\0';
                                    outstring_stream(local_210,fmsbuf_srch);
                                  }
                                  goto LAB_00219960;
                                }
                              }
                              else {
                                uVar12 = stricmp(attrname,"q");
                                iVar11 = is_end_tag_1;
                                ppcVar22 = (char **)(ulong)uVar12;
                                if (uVar12 == 0) {
                                  piVar1 = &stream->html_in_ignore;
                                  stream = local_210;
                                  if (*piVar1 == 0) {
                                    uVar12 = local_210->html_quote_level;
                                    if (is_end_tag_1 == 0) {
                                      local_210->html_quote_level = uVar12 + 1;
                                      uVar12 = (uint)((uVar12 & 1) == 0) * 4 + 0x2018;
                                    }
                                    else {
                                      uVar12 = (uVar12 & 1) * 4 + 0x2019;
                                    }
                                    uVar23 = 0;
                                    do {
                                      uVar16 = uVar23;
                                      if (0x1caf < uVar16) goto LAB_00219b3b;
                                      uVar23 = uVar16 + 0x18;
                                    } while (*(uint *)((long)&amp_tbl[0].html_cval + uVar16) !=
                                             uVar12);
                                    pcVar21 = *(char **)((long)&amp_tbl[0].expan + uVar16);
                                    if (pcVar21 == (char *)0x0) {
LAB_00219b3b:
                                      pcVar21 = fmsbuf_srch;
                                      os_xlat_html4(uVar12,pcVar21,0x32);
                                    }
                                    outstring_noxlat_stream(local_210,pcVar21);
                                    ppcVar22 = extraout_RAX_07;
                                    stream = local_210;
                                    if (iVar11 != 0) {
                                      local_210->html_quote_level = local_210->html_quote_level + -1
                                      ;
                                    }
                                  }
                                }
                                else {
                                  iVar11 = stricmp(attrname,"title");
                                  if (iVar11 == 0) {
                                    stream = local_210;
                                    if (is_end_tag_1 == 0) {
                                      iVar11 = local_210->html_in_title;
                                      if (iVar11 == 0) {
                                        *local_200 = local_1f0;
                                      }
                                      local_210->html_in_ignore = local_210->html_in_ignore + 1;
                                      uVar12 = iVar11 + 1;
                                      ppcVar22 = (char **)(ulong)uVar12;
                                      local_210->html_in_title = uVar12;
                                    }
                                    else {
                                      uVar2 = local_210->html_in_ignore;
                                      uVar3 = local_210->html_in_title;
                                      uVar12 = uVar3 - 1;
                                      local_210->html_in_ignore = uVar2 + -1;
                                      local_210->html_in_title = uVar12;
                                      ppcVar22 = (char **)(ulong)uVar12;
                                      if (uVar12 == 0) {
                                        **local_200 = '\0';
                                        os_set_title(local_1f0);
                                        ppcVar22 = extraout_RAX_06;
                                        stream = local_210;
                                      }
                                    }
                                  }
                                  else {
                                    iVar11 = stricmp(attrname,"aboutbox");
                                    if (iVar11 == 0) {
                                      if (is_end_tag_1 == 0) {
                                        uVar12 = local_210->html_in_ignore + 1;
                                      }
                                      else {
                                        uVar12 = local_210->html_in_ignore - 1;
                                      }
                                      ppcVar22 = (char **)(ulong)uVar12;
                                      local_210->html_in_ignore = uVar12;
                                      stream = local_210;
                                    }
                                    else {
                                      uVar12 = stricmp(attrname,"pre");
                                      poVar7 = local_210;
                                      ppcVar22 = (char **)(ulong)uVar12;
                                      stream = local_210;
                                      if (uVar12 == 0) {
                                        if (is_end_tag_1 == 0) {
                                          local_210->html_pre_level = local_210->html_pre_level + 1;
                                          goto LAB_00219960;
                                        }
                                        outblank_stream(local_210);
                                        uVar12 = poVar7->html_pre_level;
                                        ppcVar22 = (char **)(ulong)uVar12;
                                        stream = local_210;
                                        if (uVar12 != 0) {
                                          ppcVar22 = (char **)(ulong)(uVar12 - 1);
                                          local_210->html_pre_level = uVar12 - 1;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    stream->html_mode_flag = 1;
                    goto LAB_00219981;
                  }
                }
              }
              else if (bVar10 == 0x3c && stream->html_mode != 0) {
                bVar10 = read_tag(fmsbuf_srch,(size_t)attrname,(int *)&local_220,(char **)&local_218
                                  ,(size_t *)stream,in_R9);
                iVar11 = stricmp(fmsbuf_srch,"pre");
                if (iVar11 == 0) {
                  iVar11 = 1;
                  if ((attrname._0_4_ == 0) || (iVar11 = -1, stream->html_pre_level != 0)) {
                    stream->html_pre_level = stream->html_pre_level + iVar11;
                  }
                }
                if (bVar10 == 0) goto LAB_0021948d;
              }
LAB_00219485:
              outchar_stream(stream,bVar10);
            }
LAB_0021948d:
            uVar23 = 0;
            ppcVar22 = ppcVar28;
          }
LAB_00219490:
          uVar27 = 0;
          ppcVar28 = ppcVar22;
          bVar8 = bVar29;
          if ((!bVar29) && (bVar8 = false, local_218 != (char **)0x0)) {
            local_218 = (char **)((long)local_218 + -1);
            uVar27 = (ulong)*(byte *)local_220;
            local_220 = (char **)((long)local_220 + 1);
            bVar8 = false;
          }
          goto LAB_00218b8d;
        }
        if (bVar10 == 0x26) {
          cVar9 = out_parse_entity(fmsbuf_srch,(size_t)&local_220,(char **)&local_218,
                                   (size_t *)&switchD_00218c0d::switchdataD_002b91e0);
          uVar27 = CONCAT71(extraout_var,cVar9) & 0xffffffff;
          ppcVar22 = (char **)CONCAT71(extraout_var,cVar9);
        }
        else {
          fmsbuf_srch[0] = bVar10;
          fmsbuf_srch[1] = '\0';
          if (local_218 == (char **)0x0) {
            uVar27 = 0;
            ppcVar22 = local_218;
          }
          else {
            local_218 = (char **)((long)local_218 + -1);
            uVar27 = (ulong)*(byte *)local_220;
            ppcVar22 = local_220;
            local_220 = (char **)((long)local_220 + 1);
          }
        }
        if (stream->html_in_title != 0) {
          for (ppcVar22 = (char **)fmsbuf_srch; bVar10 = *(byte *)ppcVar22, bVar10 != 0;
              ppcVar22 = (char **)((long)ppcVar22 + 1)) {
            pbVar6 = (byte *)*ppcVar24;
            pbVar19 = pbVar6 + 1;
            if (pbVar19 < ppcVar24) {
              *ppcVar24 = (char *)pbVar19;
              *pbVar6 = bVar10;
            }
          }
        }
        uVar23 = 0;
        goto LAB_00218b8d;
      case 1:
        if (bVar10 == 0x22) {
          stream->html_mode_flag = 3;
        }
        else if (iVar11 == 0x27) {
          stream->html_mode_flag = 2;
        }
        else if (iVar11 == 0x3e) {
          stream->html_mode_flag = 0;
          if (stream->html_defer_br == 2) {
            outblank_stream(stream);
          }
          else if (stream->html_defer_br == 1) {
            outflushn_stream(stream,1);
          }
          stream->html_defer_br = 0;
          stream->html_allow_alt = 0;
        }
        else if ((-1 < (char)bVar10) &&
                (ppuVar14 = __ctype_b_loc(),
                (*(byte *)((long)*ppuVar14 + (uVar27 & 0xff) * 2 + 1) & 4) != 0)) {
          lVar20 = 0;
          do {
            if (lVar20 == 0x7f) break;
            attrname[lVar20] = (char)uVar27;
            if (local_218 == (char **)0x0) {
              local_218 = (char **)0x0;
              uVar27 = 0;
            }
            else {
              local_218 = (char **)((long)local_218 + -1);
              bVar10 = *(byte *)local_220;
              uVar27 = (ulong)bVar10;
              local_220 = (char **)((long)local_220 + 1);
              if ((char)bVar10 < '\0') {
                attrname[lVar20 + 1] = '\0';
                goto LAB_002194eb;
              }
            }
            lVar20 = lVar20 + 1;
          } while ((*(byte *)((long)*ppuVar14 + uVar27 * 2 + 1) & 0xc) != 0);
          attrname[lVar20] = '\0';
          if ((char)uVar27 == '=') {
            uVar12 = 0;
            if (local_218 == (char **)0x0) {
              ppcVar22 = (char **)0x0;
              uVar27 = 0;
              ppcVar24 = local_220;
            }
            else {
              ppcVar22 = (char **)((long)local_218 + -1);
              ppcVar24 = (char **)((long)local_220 + 1);
              bVar10 = *(byte *)local_220;
              uVar27 = (ulong)bVar10;
              if ((bVar10 == 0x27) || (bVar10 == 0x22)) {
                if (ppcVar22 == (char **)0x0) {
                  ppcVar22 = (char **)0x0;
                  uVar26 = 0;
                }
                else {
                  ppcVar22 = (char **)((long)local_218 + -2);
                  ppcVar24 = (char **)((long)local_220 + 2);
                  uVar26 = (uint)*(byte *)((long)local_220 + 1);
                }
                uVar12 = (uint)bVar10;
                uVar27 = (ulong)uVar26;
              }
            }
            local_218 = (char **)((long)ppcVar22 + -0xff);
            in_R9 = (out_stream_info *)-(long)ppcVar22;
            ppcVar18 = ppcVar22;
            for (pbVar19 = (byte *)0x0; ppcVar18 = (char **)((long)ppcVar18 + -1),
                pbVar19 != (byte *)0xff; pbVar19 = pbVar19 + 1) {
              fmsbuf_srch[(long)pbVar19] = (char)uVar27;
              if ((char **)pbVar19 == ppcVar22) {
                local_220 = (char **)((long)ppcVar24 + (long)pbVar19);
                ppcVar18 = (char **)0x0;
LAB_00219774:
                pbVar19 = (byte *)(fmsbuf_srch + 1 + (long)pbVar19);
                if (uVar12 == 0x27) {
                  stream->html_mode_flag = 2;
                }
                else if (uVar12 == 0x22) {
                  stream->html_mode_flag = 3;
                }
                else {
                  stream->html_mode_flag = 1;
                }
                uVar27 = 0;
                local_218 = ppcVar18;
                goto LAB_002197e0;
              }
              uVar26 = (uint)*(char *)((long)ppcVar24 + (long)pbVar19);
              uVar27 = (ulong)uVar26;
              if (uVar26 == 0) {
                local_220 = (char **)((char *)((long)ppcVar24 + (long)pbVar19) + 1);
                goto LAB_00219774;
              }
              if (uVar12 == 0) {
                if ((*(char *)((long)ppcVar24 + (long)pbVar19) < '\0') ||
                   ((*(byte *)((long)*ppuVar14 + (long)(int)uVar26 * 2 + 1) & 0xc) == 0))
                goto LAB_002197d1;
              }
              else if (uVar12 == uVar26) {
LAB_002197d1:
                local_220 = (char **)((char *)((long)ppcVar24 + (long)pbVar19) + 1);
                pbVar19 = (byte *)(fmsbuf_srch + 1 + (long)pbVar19);
                local_218 = ppcVar18;
                goto LAB_002197e0;
              }
            }
            local_220 = (char **)((long)ppcVar24 + 0xff);
            pbVar19 = abStack_39;
LAB_002197e0:
            if ((uVar12 != 0) && (uVar12 == (int)(char)uVar27)) {
              if (local_218 == (char **)0x0) {
                uVar27 = 0;
              }
              else {
                local_218 = (char **)((long)local_218 + -1);
                uVar27 = (ulong)*(byte *)local_220;
                local_220 = (char **)((long)local_220 + 1);
              }
            }
            *pbVar19 = 0;
          }
          else {
LAB_002194eb:
            fmsbuf_srch[0] = '\0';
          }
          iVar11 = stricmp(attrname,"height");
          if ((iVar11 == 0) && (stream->html_defer_br != 0)) {
            uVar12 = atoi(fmsbuf_srch);
            ppcVar22 = (char **)(ulong)uVar12;
            if (uVar12 == 0) {
              stream->html_defer_br = 1;
            }
            else if (1 < (int)uVar12) {
              uVar12 = uVar12 + 1;
              do {
                outblank_stream(stream);
                uVar12 = uVar12 - 1;
                ppcVar22 = extraout_RAX_03;
              } while (1 < uVar12);
            }
          }
          else {
            uVar12 = stricmp(attrname,"alt");
            ppcVar22 = (char **)(ulong)uVar12;
            if ((uVar12 == 0) && ((stream->html_in_ignore == 0 && (stream->html_allow_alt != 0)))) {
              outstring_stream(stream,fmsbuf_srch);
              ppcVar22 = extraout_RAX_02;
            }
          }
LAB_00219981:
          uVar23 = 0;
          goto LAB_00218b8d;
        }
        break;
      case 2:
        if (bVar10 == 0x27) {
LAB_00218ce2:
          stream->html_mode_flag = 1;
        }
        break;
      case 3:
        if (bVar10 == 0x22) goto LAB_00218ce2;
      }
      uVar23 = 0;
      ppcVar22 = local_218;
      uVar27 = 0;
      if (local_218 != (char **)0x0) {
        local_218 = (char **)((long)local_218 + -1);
        ppcVar22 = local_220;
        uVar27 = (ulong)*(byte *)local_220;
        local_220 = (char **)((long)local_220 + 1);
      }
      goto LAB_00218b8d;
    }
    if ((int)uVar23 != 0) {
      outchar_stream(stream,'%');
      uVar17 = extraout_RAX_08;
      for (pbVar19 = (byte *)fmsbuf; iVar11 = (int)uVar17, pbVar19 < ppcVar28; pbVar19 = pbVar19 + 1
          ) {
        outchar_stream(stream,*pbVar19);
        uVar17 = extraout_RAX_09;
      }
    }
    G_recurse = G_recurse + -1;
  }
  return iVar11;
}

Assistant:

static int outformatlen_stream(out_stream_info *stream,
                               char *s, size_t slen)
{
    char     c;
    int      done = 0;
    char     fmsbuf[40];       /* space for constructing translation string */
    uint     fmslen;
    char    *f = 0;
    char    *f1;
    int      infmt = 0;

    /* 
     *   This routine can recurse because of format strings ("%xxx%"
     *   sequences).  When we recurse, we want to ensure that the
     *   recursion is directed to the original stream only.  So, note the
     *   current stream statically in case we re-enter the formatter. 
     */
    if (!out_push_stream(stream))
        return 0;

    /* get the first character */
    c = nextout(&s, &slen);

    /* if we have anything to show, show it */
    while (c != '\0')
    {
        /* check if we're collecting translation string */
        if (infmt)
        {
            /*
             *   if the string is too long for our buffer, or we've come
             *   across a backslash (illegal in a format string), or we've
             *   come across an HTML-significant character ('&' or '<') in
             *   HTML mode, we must have a stray percent sign; dump the
             *   whole string so far and act as though we have no format
             *   string 
             */
            if (c == '\\'
                || f == &fmsbuf[sizeof(fmsbuf)]
                || (stream->html_mode && (c == '<' || c == '&')))
            {
                outchar_stream(stream, '%');
                for (f1 = fmsbuf ; f1 < f ; ++f1)
                    outchar_stream(stream, *f1);
                infmt = 0;

                /* process this character again */
                continue;
            }
            else if (c == '%' && f == fmsbuf)       /* double percent sign? */
            {
                outchar_stream(stream, '%');       /* send out a single '%' */
                infmt = 0;       /* no longer processing translation string */
            }
            else if (c == '%')   /* found end of string? translate it if so */
            {
                uchar *fms;
                int    initcap = FALSE;
                int    allcaps = FALSE;
                char   fmsbuf_srch[sizeof(fmsbuf)];

                /* null-terminate the string */
                *f = '\0';

                /* check for an init cap */
                if (outisup(fmsbuf[0]))
                {
                    /* 
                     *   note the initial capital, so that we follow the
                     *   original capitalization in the substituted string 
                     */
                    initcap = TRUE;

                    /* 
                     *   if the second letter is capitalized as well,
                     *   capitalize the entire substituted string 
                     */
                    if (fmsbuf[1] != '\0' && outisup(fmsbuf[1]))
                    {
                        /* use all caps */
                        allcaps = TRUE;
                    }
                }

                /* convert the entire string to lower case for searching */
                strcpy(fmsbuf_srch, fmsbuf);
                os_strlwr(fmsbuf_srch);
                
                /* find the string in the format string table */
                fmslen = strlen(fmsbuf_srch);
                for (fms = fmsbase ; fms < fmstop ; )
                {
                    uint propnum;
                    uint len;

                    /* get the information on this entry */
                    propnum = osrp2(fms);
                    len = osrp2(fms + 2) - 2;

                    /* check for a match */
                    if (len == fmslen &&
                        !memcmp(fms + 4, fmsbuf_srch, (size_t)len))
                    {
                        int old_all_caps;

                        /* note the current ALLCAPS mode */
                        old_all_caps = stream->allcapsflag;
                        
                        /* 
                         *   we have a match - set the appropriate
                         *   capitalization mode 
                         */
                        if (allcaps)
                            outallcaps_stream(stream, TRUE);
                        else if (initcap)
                            outcaps_stream(stream);

                        /* 
                         *   evaluate the associated property to generate
                         *   the substitution text 
                         */
                        runppr(runctx, cmdActor, (prpnum)propnum, 0);

                        /* turn off ALLCAPS mode */
                        outallcaps_stream(stream, old_all_caps);

                        /* no need to look any further */
                        break;
                    }

                    /* move on to next formatstring if not yet found */
                    fms += len + 4;
                }

                /* if we can't find it, dump the format string as-is */
                if (fms == fmstop)
                {
                    outchar_stream(stream, '%');
                    for (f1 = fmsbuf ; f1 < f ; ++f1)
                        outchar_stream(stream, *f1);
                    outchar_stream(stream, '%');
                }

                /* no longer reading format string */
                infmt = 0;
            }
            else
            {
                /* copy this character of the format string */
                *f++ = c;
            }

            /* move on to the next character and continue scanning */
            c = nextout(&s, &slen);
            continue;
        }
        
        /*
         *   If we're parsing HTML here, and we're inside a tag, skip
         *   characters until we reach the end of the tag.  
         */
        if (stream->html_mode_flag != HTML_MODE_NORMAL)
        {
            switch(stream->html_mode_flag)
            {
            case HTML_MODE_TAG:
                /* 
                 *   keep skipping up to the closing '>', but note when we
                 *   enter any quoted section 
                 */
                switch(c)
                {
                case '>':
                    /* we've reached the end of the tag */
                    stream->html_mode_flag = HTML_MODE_NORMAL;

                    /* if we have a deferred <BR>, process it now */
                    switch(stream->html_defer_br)
                    {
                    case HTML_DEFER_BR_NONE:
                        /* no deferred <BR> */
                        break;

                    case HTML_DEFER_BR_FLUSH:
                        outflushn_stream(stream, 1);
                        break;

                    case HTML_DEFER_BR_BLANK:
                        outblank_stream(stream);
                        break;
                    }

                    /* no more deferred <BR> pending */
                    stream->html_defer_br = HTML_DEFER_BR_NONE;

                    /* no more ALT attribute allowed */
                    stream->html_allow_alt = FALSE;
                    break;

                case '"':
                    /* enter a double-quoted string */
                    stream->html_mode_flag = HTML_MODE_DQUOTE;
                    break;

                case '\'':
                    /* enter a single-quoted string */
                    stream->html_mode_flag = HTML_MODE_SQUOTE;
                    break;

                default:
                    /* if it's alphabetic, note the attribute name */
                    if (outisal(c))
                    {
                        char attrname[128];
                        char attrval[256];
                        char *dst;

                        /* gather up the attribute name */
                        for (dst = attrname ;
                             dst + 1 < attrname + sizeof(attrname) ; )
                        {
                            /* store this character */
                            *dst++ = c;

                            /* get the next character */
                            c = nextout(&s, &slen);

                            /* if it's not alphanumeric, stop scanning */
                            if (!outisal(c) && !outisdg(c))
                                break;
                        }

                        /* null-terminate the result */
                        *dst++ = '\0';

                        /* gather the value if present */
                        if (c == '=')
                        {
                            char qu;
                            
                            /* skip the '=' */
                            c = nextout(&s, &slen);

                            /* if we have a quote, so note */
                            if (c == '"' || c == '\'')
                            {
                                /* remember the quote */
                                qu = c;

                                /* skip it */
                                c = nextout(&s, &slen);
                            }
                            else
                            {
                                /* no quote */
                                qu = 0;
                            }

                            /* read the value */
                            for (dst = attrval ;
                                 dst + 1 < attrval + sizeof(attrval) ; )
                            {
                                /* store this character */
                                *dst++ = c;

                                /* read the next one */
                                c = nextout(&s, &slen);
                                if (c == '\0')
                                {
                                    /* 
                                     *   we've reached the end of the
                                     *   string, and we're still inside
                                     *   this attribute - abandon the
                                     *   attribute but note that we're
                                     *   inside a quoted string if
                                     *   necessary 
                                     */
                                    if (qu == '"')
                                        stream->html_mode_flag =
                                            HTML_MODE_DQUOTE;
                                    else if (qu == '\'')
                                        stream->html_mode_flag =
                                            HTML_MODE_SQUOTE;
                                    else
                                        stream->html_mode_flag
                                            = HTML_MODE_TAG;

                                    /* stop scanning the string */
                                    break;
                                }

                                /* 
                                 *   if we're looking for a quote, check
                                 *   for the closing quote; otherwise,
                                 *   check for alphanumerics 
                                 */
                                if (qu != 0)
                                {
                                    /* if this is our quote, stop scanning */
                                    if (c == qu)
                                        break;
                                }
                                else
                                {
                                    /* if it's non-alphanumeric, we're done */
                                    if (!outisal(c) && !outisdg(c))
                                        break;
                                }
                            }

                            /* skip the closing quote, if necessary */
                            if (qu != 0 && c == qu)
                                c = nextout(&s, &slen);

                            /* null-terminate the value string */
                            *dst = '\0';
                        }
                        else
                        {
                            /* no value */
                            attrval[0] = '\0';
                        }

                        /* 
                         *   see if we recognize it, and it's meaningful
                         *   in the context of the current tag 
                         */
                        if (!stricmp(attrname, "height")
                            && stream->html_defer_br != HTML_DEFER_BR_NONE)
                        {
                            int ht;
                                
                            /*
                             *   If the height is zero, always treat this
                             *   as a non-blanking flush.  If it's one,
                             *   treat it as we originally planned to.  If
                             *   it's greater than one, add n blank lines.
                             */
                            ht = atoi(attrval);
                            if (ht == 0)
                            {
                                /* always use non-blanking flush */
                                stream->html_defer_br = HTML_DEFER_BR_FLUSH;
                            }
                            else if (ht == 1)
                            {
                                /* keep original setting */
                            }
                            else
                            {
                                for ( ; ht > 0 ; --ht)
                                    outblank_stream(stream);
                            }
                        }
                        else if (!stricmp(attrname, "alt")
                                 && !stream->html_in_ignore
                                 && stream->html_allow_alt)
                        {
                            /* write out the ALT string */
                            outstring_stream(stream, attrval);
                        }

                        /* 
                         *   since we already read the next character,
                         *   simply loop back immediately 
                         */
                        continue;
                    }
                    break;
                }
                break;

            case HTML_MODE_DQUOTE:
                /* if we've reached the closing quote, return to tag state */
                if (c == '"')
                    stream->html_mode_flag = HTML_MODE_TAG;
                break;

            case HTML_MODE_SQUOTE:
                /* if we've reached the closing quote, return to tag state */
                if (c == '\'')
                    stream->html_mode_flag = HTML_MODE_TAG;
                break;
            }

            /* 
             *   move on to the next character, and start over with the
             *   new character 
             */
            c = nextout(&s, &slen);
            continue;
        }

        /*
         *   If we're in a title, and this isn't the start of a new tag,
         *   skip the character - we suppress all regular text output
         *   inside a <TITLE> ... </TITLE> sequence. 
         */
        if (stream->html_in_ignore && c != '<')
        {
            /* check for entities */
            char cbuf[50];
            if (c == '&')
            {
                /* translate the entity */
                c = out_parse_entity(cbuf, sizeof(cbuf), &s, &slen);
            }
            else
            {
                /* it's an ordinary character - copy it out literally */
                cbuf[0] = c;
                cbuf[1] = '\0';

                /* get the next character */
                c = nextout(&s, &slen);
            }

            /* 
             *   if we're gathering a title, and there's room in the title
             *   buffer for more (always leaving room for a null
             *   terminator), add this to the title buffer 
             */
            if (stream->html_in_title)
            {
                char *cbp;
                for (cbp = cbuf ; *cbp != '\0' ; ++cbp)
                {
                    /* if there's room, add it */
                    if (stream->html_title_ptr + 1 <
                        stream->html_title_buf
                        + sizeof(stream->html_title_buf))
                        *stream->html_title_ptr++ = *cbp;
                }
            }

            /* don't display anything in an ignore section */
            continue;
        }
        
        if ( c == '%' )                              /* translation string? */
        {
            infmt = 1;
            f = fmsbuf;
        }
        else if ( c == '\\' )                       /* special escape code? */
        {
            c = nextout(&s, &slen);
            
            if (stream->capturing && c != '^' && c != 'v' && c != '\0')
            {
                outchar_stream(stream, '\\');
                outchar_stream(stream, c);

                /* keep the \- and also put out the next two chars */
                if (c == '-')
                {
                    outchar_stream(stream, nextout(&s, &slen));
                    outchar_stream(stream, nextout(&s, &slen));
                }
            }
            else
            {
                switch(c)
                {
                case 'H':                                /* HTML mode entry */
                    /* turn on HTML mode in the renderer */
                    switch(c = nextout(&s, &slen))
                    {
                    case '-':
                        /* if we have an HTML target, notify it */
                        if (stream->html_target)
                        {
                            /* flush its stream */
                            outflushn_stream(stream, 0);

                            /* tell the OS layer to switch to normal mode */
                            out_end_html(stream);
                        }

                        /* switch to normal mode */
                        stream->html_mode = FALSE;
                        break;

                    case '+':
                    default:
                        /* if we have an HTML target, notify it */
                        if (stream->html_target)
                        {
                            /* flush the underlying stream */
                            outflushn_stream(stream, 0);

                            /* tell the OS layer to switch to HTML mode */
                            out_start_html(stream);
                        }
                        
                        /* switch to HTML mode */
                        stream->html_mode = TRUE;

                        /* 
                         *   if the character wasn't a "+", it's not part
                         *   of the "\H" sequence, so display it normally 
                         */
                        if (c != '+' && c != 0)
                            outchar_stream(stream, c);
                        break;
                    }

                    /* this sequence doesn't result in any actual output */
                    break;

                case 'n':                                       /* newline? */
                    outflushn_stream(stream, 1);        /* yes, output line */
                    break;
                    
                case 't':                                           /* tab? */
                    outtab_stream(stream);
                    break;
                    
                case 'b':                                    /* blank line? */
                    outblank_stream(stream);
                    break;
                    
                case '\0':                               /* line ends here? */
                    done = 1;
                    break;

                case ' ':                                   /* quoted space */
                    if (stream->html_target && stream->html_mode)
                    {
                        /* 
                         *   we're generating for an HTML target and we're
                         *   in HTML mode - generate the HTML non-breaking
                         *   space 
                         */
                        outstring_stream(stream, "&nbsp;");
                    }
                    else
                    {
                        /* 
                         *   we're not in HTML mode - generate our
                         *   internal quoted space character 
                         */
                        outchar_stream(stream, QSPACE);
                    }
                    break;

                case '^':                      /* capitalize next character */
                    stream->capsflag = 1;
                    stream->nocapsflag = 0;
                    break;

                case 'v':
                    stream->nocapsflag = 1;
                    stream->capsflag = 0;
                    break;

                case '(':
                    /* generate HTML if in the appropriate mode */
                    if (stream->html_mode && stream->html_target)
                    {
                        /* send HTML to the renderer */
                        outstring_stream(stream, "<B>");
                    }
                    else
                    {
                        /* turn on the 'hilite' attribute */
                        stream->cur_attr |= OS_ATTR_HILITE;
                    }
                    break;

                case ')':
                    /* generate HTML if in the appropriate mode */
                    if (stream->html_mode && stream->html_target)
                    {
                        /* send HTML to the renderer */
                        outstring_stream(stream, "</B>");
                    }
                    else
                    {
                        /* turn off the 'hilite' attribute */
                        stream->cur_attr &= ~OS_ATTR_HILITE;
                    }
                    break;

                case '-':
                    outchar_stream(stream, nextout(&s, &slen));
                    outchar_stream(stream, nextout(&s, &slen));
                    break;
                    
                default:                 /* just pass invalid escapes as-is */
                    outchar_stream(stream, c);
                    break;
                }
            }
        }
        else if (!stream->html_target
                 && stream->html_mode
                 && (c == '<' || c == '&'))
        {
            /*
             *   We're in HTML mode, but the underlying target does not
             *   accept HTML sequences.  It appears we're at the start of
             *   an "&" entity or a tag sequence, so parse it, remove it,
             *   and replace it (if possible) with a text-only equivalent. 
             */
            if (c == '<')
            {
                /* read the tag */
                char tagbuf[50];
                int is_end_tag;
                c = read_tag(tagbuf, sizeof(tagbuf), &is_end_tag,
                             &s, &slen, 0);

                /*
                 *   Check to see if we recognize the tag.  We only
                 *   recognize a few simple tags that map easily to
                 *   character mode. 
                 */
                if (!stricmp(tagbuf, "br"))
                {
                    /* 
                     *   line break - if there's anything buffered up,
                     *   just flush the current line, otherwise write out
                     *   a blank line 
                     */
                    if (stream->html_in_ignore)
                        /* suppress breaks in ignore mode */;
                    else if (stream->linepos != 0)
                        stream->html_defer_br = HTML_DEFER_BR_FLUSH;
                    else
                        stream->html_defer_br = HTML_DEFER_BR_BLANK;
                }
                else if (!stricmp(tagbuf, "b")
                         || !stricmp(tagbuf, "i")
                         || !stricmp(tagbuf, "em")
                         || !stricmp(tagbuf, "strong"))
                {
                    int attr;
                    
                    /* choose the attribute flag */
                    switch (tagbuf[0])
                    {
                    case 'b':
                    case 'B':
                        attr = OS_ATTR_BOLD;
                        break;

                    case 'i':
                    case 'I':
                        attr = OS_ATTR_ITALIC;
                        break;

                    case 'e':
                    case 'E':
                        attr = OS_ATTR_EM;
                        break;

                    case 's':
                    case 'S':
                        attr = OS_ATTR_STRONG;
                        break;
                    }
                    
                    /* bold on/off - send out appropriate os-layer code */
                    if (stream->html_in_ignore)
                    {
                        /* suppress any change in 'ignore' mode */
                    }
                    else if (!is_end_tag)
                    {
                        /* turn on the selected attribute */
                        stream->cur_attr |= attr;
                    }
                    else
                    {
                        /* turn off the selected attribute */
                        stream->cur_attr &= ~attr;
                    }
                }
                else if (!stricmp(tagbuf, "p"))
                {
                    /* paragraph - send out a blank line */
                    if (!stream->html_in_ignore)
                        outblank_stream(stream);
                }
                else if (!stricmp(tagbuf, "tab"))
                {
                    /* tab - send out a \t */
                    if (!stream->html_in_ignore)
                        outtab_stream(stream);
                }
                else if (!stricmp(tagbuf, "img") || !stricmp(tagbuf, "sound"))
                {
                    /* IMG and SOUND - allow ALT attributes */
                    stream->html_allow_alt = TRUE;
                }
                else if (!stricmp(tagbuf, "hr"))
                {
                    int rem;
                    
                    if (!stream->html_in_ignore)
                    {
                        /* start a new line */
                        outflushn_stream(stream, 1);

                        /* write out underscores to the display width */
                        for (rem = G_os_linewidth - 1 ; rem > 0 ; )
                        {
                            char dashbuf[100];
                            int cur;
                            
                            /* do as much as we can on this pass */
                            cur = rem;
                            if ((size_t)cur > sizeof(dashbuf) - 1)
                                cur = sizeof(dashbuf) - 1;
                            
                            /* do a buffer-full of dashes */
                            memset(dashbuf, '_', cur);
                            dashbuf[cur] = '\0';
                            outstring_stream(stream, dashbuf);
                            
                            /* deduct this from the total */
                            rem -= cur;
                        }

                        /* put a blank line after the underscores */
                        outblank_stream(stream);
                    }
                }
                else if (!stricmp(tagbuf, "q"))
                {
                    unsigned int htmlchar;

                    if (!stream->html_in_ignore)
                    {
                        /* if it's an open quote, increment the level */
                        if (!is_end_tag)
                            ++(stream->html_quote_level);
                        
                        /* add the open quote */
                        htmlchar =
                            (!is_end_tag
                             ? ((stream->html_quote_level & 1) == 1
                                ? 8220 : 8216)
                             : ((stream->html_quote_level & 1) == 1
                                ? 8221 : 8217));
                        
                        /* 
                         *   write out the HTML character, translated to
                         *   the local character set 
                         */
                        outchar_html_stream(stream, htmlchar);
                        
                        /* if it's a close quote, decrement the level */
                        if (is_end_tag)
                            --(stream->html_quote_level);
                    }
                }
                else if (!stricmp(tagbuf, "title"))
                {
                    /* 
                     *   Turn ignore mode on or off as appropriate, and
                     *   turn on or off title mode as well.
                     */
                    if (is_end_tag)
                    {
                        /* 
                         *   note that we're leaving an ignore section and
                         *   a title section 
                         */
                        --(stream->html_in_ignore);
                        --(stream->html_in_title);

                        /* 
                         *   if we're no longer in a title, call the OS
                         *   layer to tell it the title string, in case it
                         *   wants to change the window title or otherwise
                         *   make use of the title 
                         */
                        if (stream->html_in_title == 0)
                        {
                            /* null-terminate the title string */
                            *stream->html_title_ptr = '\0';
                            
                            /* tell the OS about the title */
                            os_set_title(stream->html_title_buf);
                        }
                    }
                    else
                    {
                        /* 
                         *   if we aren't already in a title, set up to
                         *   capture the title into the title buffer 
                         */
                        if (!stream->html_in_title)
                            stream->html_title_ptr = stream->html_title_buf;

                        /* 
                         *   note that we're in a title and in an ignore
                         *   section, since nothing within gets displayed 
                         */
                        ++(stream->html_in_ignore);
                        ++(stream->html_in_title);
                    }
                }
                else if (!stricmp(tagbuf, "aboutbox"))
                {
                    /* turn ignore mode on or off as appropriate */
                    if (is_end_tag)
                        --(stream->html_in_ignore);
                    else
                        ++(stream->html_in_ignore);
                }
                else if (!stricmp(tagbuf, "pre"))
                {
                    /* count the nesting level if starting PRE mode */
                    if (!is_end_tag)
                        stream->html_pre_level += 1;

                    /* surround the PRE block with line breaks */
                    outblank_stream(stream);

                    /* count the nesting level if ending PRE mode */
                    if (is_end_tag && stream->html_pre_level != 0)
                        stream->html_pre_level -= 1;
                }

                /* suppress everything up to the next '>' */
                stream->html_mode_flag = HTML_MODE_TAG;

                /* 
                 *   continue with the current character; since we're in
                 *   html tag mode, we'll skip everything until we get to
                 *   the closing '>' 
                 */
                continue;
            }
            else if (c == '&')
            {
                /* parse it */
                char  xlat_buf[50];
                c = out_parse_entity(xlat_buf, sizeof(xlat_buf), &s, &slen);

                /* write it out (we've already translated it) */
                outstring_noxlat_stream(stream, xlat_buf);
                
                /* proceed with the next character */
                continue;
            }
        }
        else if (stream->html_target && stream->html_mode && c == '<')
        {
            /*
             *   We're in HTML mode, and we have an underlying HTML target.
             *   We don't need to do much HTML interpretation at this level.
             *   However, we do need to keep track of when we're in a PRE
             *   block, so that we can pass whitespaces and newlines through
             *   to the underlying HTML engine without filtering when we're
             *   in preformatted text. 
             */
            char tagbuf[50];
            int is_end_tag;
            c = read_tag(tagbuf, sizeof(tagbuf), &is_end_tag,
                         &s, &slen, stream);

            /* check for special tags */
            if (!stricmp(tagbuf, "pre"))
            {
                /* count the nesting level */
                if (!is_end_tag)
                    stream->html_pre_level += 1;
                else if (is_end_tag && stream->html_pre_level != 0)
                    stream->html_pre_level -= 1;
            }

            /* copy the last character after the tag to the stream */
            if (c != 0)
                outchar_stream(stream, c);
        }
        else
        {
            /* normal character */
            outchar_stream(stream, c);
        }

        /* move on to the next character, unless we're finished */
        if (done)
            c = '\0';
        else
            c = nextout(&s, &slen);
    }

    /* if we ended up inside what looked like a format string, dump string */
    if (infmt)
    {
        outchar_stream(stream, '%');
        for (f1 = fmsbuf ; f1 < f ; ++f1)
            outchar_stream(stream, *f1);
    }

    /* exit a recursion level */
    out_pop_stream();

    /* success */
    return 0;
}